

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

int bigcomp(U *rv,char *s0,BCinfo *bc)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  uint32 uVar4;
  int iVar5;
  U *pUVar6;
  Bigint *pBVar7;
  Bigint *b;
  Bigint *pBVar8;
  Bigint *pBVar9;
  Bigint *b_00;
  long lVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  double dVar16;
  int local_50;
  uint local_4c;
  uint32 local_48;
  int local_44;
  U *local_40;
  char *local_38;
  
  uVar3 = bc->nd;
  local_44 = bc->nd0;
  uVar14 = bc->e0 + uVar3;
  pBVar7 = sd2b(rv,bc->scale,&local_50);
  if (pBVar7 == (Bigint *)0x0) {
    return -1;
  }
  uVar4 = pBVar7->x[0];
  local_38 = s0;
  pBVar7 = lshift(pBVar7,1);
  if (pBVar7 == (Bigint *)0x0) {
    return -1;
  }
  *(byte *)pBVar7->x = (byte)pBVar7->x[0] | 1;
  iVar11 = ~uVar14 + local_50;
  local_50 = iVar11;
  local_48 = uVar4;
  local_40 = rv;
  b = i2b(1);
  b_00 = pBVar7;
  if (b == (Bigint *)0x0) goto LAB_0010ee8f;
  if ((int)uVar14 < 1) {
    if ((int)uVar14 < 0) {
      pBVar7 = pow5mult(pBVar7,-uVar14);
      pBVar8 = b;
      pBVar9 = pBVar7;
      goto joined_r0x0010ecd2;
    }
  }
  else {
    pBVar8 = pow5mult(b,uVar14);
    b = pBVar7;
    pBVar9 = pBVar8;
joined_r0x0010ecd2:
    b_00 = b;
    b = pBVar8;
    if (pBVar9 == (Bigint *)0x0) goto LAB_0010ee8f;
  }
  b_00 = b;
  iVar12 = -iVar11;
  iVar15 = 0;
  iVar5 = iVar15;
  if (iVar11 < 1) {
    iVar11 = iVar15;
    iVar5 = iVar12;
  }
  iVar12 = hi0bits(b_00->x[(long)b_00->wds + -1]);
  if (0 < iVar5) {
    iVar15 = iVar5;
  }
  uVar14 = (iVar12 - iVar15) + 0x1cU & 0x1f;
  if ((iVar11 + uVar14 == 0) || (pBVar7 = lshift(pBVar7,iVar11 + uVar14), pBVar7 != (Bigint *)0x0))
  {
    iVar11 = uVar14 + iVar5;
    if ((iVar11 == 0 || SCARRY4(uVar14,iVar5) != iVar11 < 0) ||
       (b_00 = lshift(b_00,iVar11), b_00 != (Bigint *)0x0)) {
      uVar14 = pBVar7->wds - b_00->wds;
      if (uVar14 == 0) {
        lVar10 = (long)b_00->wds * 4 + 0x1c;
        do {
          uVar14 = *(uint *)((long)pBVar7->x + lVar10 + -0x20);
          uVar13 = *(uint *)((long)b_00->x + lVar10 + -0x20);
          if (uVar14 != uVar13) {
            uVar14 = -(uint)(uVar14 < uVar13) | 1;
            goto LAB_0010edab;
          }
          lVar10 = lVar10 + -4;
        } while (0x1c < lVar10);
        uVar14 = 0;
      }
LAB_0010edab:
      uVar13 = 0xffffffff;
      if ((int)uVar14 < 0) {
        local_4c = 1;
        if (1 < (int)uVar3) {
          local_4c = uVar3;
        }
        uVar14 = 0;
        do {
          pBVar7 = multadd(pBVar7,10,0);
          if (pBVar7 == (Bigint *)0x0) {
            if (b_00 == (Bigint *)0x0) {
              return -1;
            }
            goto LAB_0010ee8f;
          }
          uVar1 = uVar14 + 1;
          uVar13 = uVar1;
          if ((int)uVar14 < local_44) {
            uVar13 = uVar14;
          }
          cVar2 = local_38[uVar13];
          iVar11 = quorem(pBVar7,b_00);
          uVar13 = (cVar2 - iVar11) - 0x30;
          if (uVar13 != 0) goto LAB_0010edb4;
          if ((pBVar7->x[0] == 0) && (pBVar7->wds == 1)) {
            uVar13 = (uint)((int)(uVar14 + 1) < (int)uVar3);
            goto LAB_0010edb4;
          }
          uVar14 = uVar1;
        } while (local_4c != uVar1);
        uVar13 = 0xffffffff;
      }
LAB_0010edb4:
      if (pBVar7 != (Bigint *)0x0) {
        ckd_free(pBVar7);
      }
      if (b_00 != (Bigint *)0x0) {
        ckd_free(b_00);
      }
      pUVar6 = local_40;
      if ((int)uVar13 < 1) {
        if (uVar13 != 0) {
          return 0;
        }
        local_48 = local_48 & 1;
        if (local_48 == 0) {
          return 0;
        }
      }
      dVar16 = sulp(local_40,bc);
      pUVar6->d = dVar16 + pUVar6->d;
      return 0;
    }
    b_00 = pBVar7;
    if (pBVar7 == (Bigint *)0x0) {
      return -1;
    }
  }
LAB_0010ee8f:
  ckd_free(b_00);
  return -1;
}

Assistant:

static int
bigcomp(U *rv, const char *s0, BCinfo *bc)
{
    Bigint *b, *d;
    int b2, d2, dd, i, nd, nd0, odd, p2, p5;

    nd = bc->nd;
    nd0 = bc->nd0;
    p5 = nd + bc->e0;
    b = sd2b(rv, bc->scale, &p2);
    if (b == NULL)
        return -1;

    /* record whether the lsb of rv/2^(bc->scale) is odd:  in the exact halfway
       case, this is used for round to even. */
    odd = b->x[0] & 1;

    /* left shift b by 1 bit and or a 1 into the least significant bit;
       this gives us b * 2**p2 = rv/2^(bc->scale) + 0.5 ulp. */
    b = lshift(b, 1);
    if (b == NULL)
        return -1;
    b->x[0] |= 1;
    p2--;

    p2 -= p5;
    d = i2b(1);
    if (d == NULL) {
        Bfree(b);
        return -1;
    }
    /* Arrange for convenient computation of quotients:
     * shift left if necessary so divisor has 4 leading 0 bits.
     */
    if (p5 > 0) {
        d = pow5mult(d, p5);
        if (d == NULL) {
            Bfree(b);
            return -1;
        }
    }
    else if (p5 < 0) {
        b = pow5mult(b, -p5);
        if (b == NULL) {
            Bfree(d);
            return -1;
        }
    }
    if (p2 > 0) {
        b2 = p2;
        d2 = 0;
    }
    else {
        b2 = 0;
        d2 = -p2;
    }
    i = dshift(d, d2);
    if ((b2 += i) > 0) {
        b = lshift(b, b2);
        if (b == NULL) {
            Bfree(d);
            return -1;
        }
    }
    if ((d2 += i) > 0) {
        d = lshift(d, d2);
        if (d == NULL) {
            Bfree(b);
            return -1;
        }
    }

    /* Compare s0 with b/d: set dd to -1, 0, or 1 according as s0 < b/d, s0 ==
     * b/d, or s0 > b/d.  Here the digits of s0 are thought of as representing
     * a number in the range [0.1, 1). */
    if (cmp(b, d) >= 0)
        /* b/d >= 1 */
        dd = -1;
    else {
        i = 0;
        for(;;) {
            b = multadd(b, 10, 0);
            if (b == NULL) {
                Bfree(d);
                return -1;
            }
            dd = s0[i < nd0 ? i : i+1] - '0' - quorem(b, d);
            i++;

            if (dd)
                break;
            if (!b->x[0] && b->wds == 1) {
                /* b/d == 0 */
                dd = i < nd;
                break;
            }
            if (!(i < nd)) {
                /* b/d != 0, but digits of s0 exhausted */
                dd = -1;
                break;
            }
        }
    }
    Bfree(b);
    Bfree(d);
    if (dd > 0 || (dd == 0 && odd))
        dval(rv) += sulp(rv, bc);
    return 0;
}